

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  xpath_value_type xVar4;
  xpath_memory_block *pxVar5;
  xpath_memory_block *pxVar6;
  xml_node_struct *pxVar7;
  xml_node_struct *pxVar8;
  bool bVar9;
  undefined1 uVar10;
  bool bVar11;
  int *piVar12;
  xml_attribute xVar13;
  byte *pbVar14;
  char *pcVar15;
  long lVar16;
  int *dst;
  xpath_allocator *pxVar17;
  size_t sVar18;
  xpath_allocator *pxVar19;
  xpath_node *pxVar20;
  xpath_ast_node *pxVar21;
  xpath_ast_node *this_00;
  xpath_ast_node *pxVar22;
  char_t *src;
  byte bVar23;
  less_equal *in_R8;
  byte bVar24;
  xpath_memory_block *pxVar25;
  undefined1 uVar26;
  double dVar27;
  double dVar28;
  double v;
  size_t local_c8;
  xpath_node *local_c0;
  size_t local_b8;
  size_t local_a8;
  xml_node_struct *local_a0;
  xpath_node *local_98;
  xpath_node *local_90;
  xml_node_struct *local_80;
  xpath_node *local_78;
  xpath_node *local_70;
  xpath_string local_60;
  xpath_string local_48;
  
  uVar26 = xpath_type_none;
LAB_0038451f:
  cVar1 = this->_type;
  uVar10 = xpath_type_node_set;
  switch(cVar1) {
  case '\x01':
    bVar9 = eval_boolean(this->_left,c,stack);
    if (bVar9) goto switchD_00384567_caseD_2f;
    break;
  case '\x02':
    bVar9 = eval_boolean(this->_left,c,stack);
    if (!bVar9) goto switchD_00384567_caseD_30;
    break;
  case '\x03':
    goto switchD_00384536_caseD_3;
  case '\x04':
    pxVar21 = this->_left;
    this = this->_right;
    cVar1 = pxVar21->_rettype;
    cVar2 = this->_rettype;
    if ((cVar1 == '\x01') || (cVar2 == '\x01')) {
      if (cVar2 == '\x01' && cVar1 == '\x01') {
        pxVar19 = stack->result;
        pxVar25 = pxVar19->_root;
        local_a8 = pxVar19->_root_size;
        eval_node_set((xpath_node_set_raw *)&local_a0,pxVar21,c,stack,nodeset_eval_all);
        eval_node_set((xpath_node_set_raw *)&local_80,this,c,stack,nodeset_eval_all);
        local_c0 = local_98;
        uVar10 = local_98 != local_90;
        if (!(bool)uVar10) goto LAB_0038515e;
        uVar10 = true;
        pxVar20 = local_78;
        goto LAB_003850b1;
      }
      pxVar22 = pxVar21;
      if (cVar1 == '\x01') {
        pxVar22 = this;
        cVar1 = cVar2;
        this = pxVar21;
      }
      if (cVar1 == '\x02') {
        pxVar19 = stack->result;
        pxVar25 = pxVar19->_root;
        local_a8 = pxVar19->_root_size;
        dVar27 = eval_number(pxVar22,c,stack);
        eval_node_set((xpath_node_set_raw *)&local_a0,this,c,stack,nodeset_eval_all);
        bVar9 = local_98 == local_90;
        pxVar20 = local_98;
        goto LAB_00385409;
      }
      if (cVar1 == '\x03') {
        pxVar19 = stack->result;
        pxVar25 = pxVar19->_root;
        local_b8 = pxVar19->_root_size;
        eval_string((xpath_string *)&local_80,pxVar22,c,stack);
        eval_node_set((xpath_node_set_raw *)&local_a0,this,c,stack,nodeset_eval_all);
        bVar9 = local_98 == local_90;
        pxVar20 = local_98;
        goto LAB_00385311;
      }
      if (cVar1 == '\x04') {
        bVar9 = eval_boolean(pxVar22,c,stack);
        bVar11 = eval_boolean(this,c,stack);
        uVar10 = bVar11 != bVar9;
        goto switchD_00384567_caseD_2f;
      }
LAB_00385504:
      pcVar15 = 
      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::not_equal_to]"
      ;
      goto LAB_003854fa;
    }
    if (cVar1 != '\x04' && cVar2 != '\x04') {
      if (cVar1 != '\x02' && cVar2 != '\x02') {
        if (cVar1 != '\x03' && cVar2 != '\x03') goto LAB_00385504;
        pxVar19 = stack->result;
        pxVar25 = pxVar19->_root;
        local_c8 = pxVar19->_root_size;
        eval_string((xpath_string *)&local_a0,pxVar21,c,stack);
        eval_string((xpath_string *)&local_80,this,c,stack);
        bVar9 = strequal((char_t *)local_a0,(char_t *)local_80);
        pxVar5 = pxVar19->_root;
        while (pxVar5 != pxVar25) {
          pxVar5 = pxVar5->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
        uVar10 = !bVar9;
        pxVar19->_root = pxVar25;
        goto LAB_00384e0d;
      }
      dVar27 = eval_number(pxVar21,c,stack);
      dVar28 = eval_number(this,c,stack);
      uVar10 = dVar28 != dVar27;
      goto switchD_00384567_caseD_2f;
    }
    bVar9 = eval_boolean(pxVar21,c,stack);
    uVar26 = uVar26 ^ bVar9;
    goto LAB_0038451f;
  case '\x05':
    pxVar22 = this->_left;
    pxVar21 = this->_right;
    goto LAB_0038472c;
  case '\x06':
    pxVar21 = this->_left;
    pxVar22 = this->_right;
LAB_0038472c:
    uVar10 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                       (pxVar22,pxVar21,c,stack,(less *)in_R8);
    goto switchD_00384567_caseD_2f;
  case '\a':
    pxVar22 = this->_left;
    pxVar21 = this->_right;
    goto LAB_00384713;
  case '\b':
    pxVar21 = this->_left;
    pxVar22 = this->_right;
LAB_00384713:
    uVar10 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                       (pxVar22,pxVar21,c,stack,in_R8);
    goto switchD_00384567_caseD_2f;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_00384536_caseD_9;
  case '\x14':
    xVar4 = ((this->_data).variable)->_type;
    if (xVar4 != (int)this->_rettype) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2969,
                    "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x04') {
      if (xVar4 != xpath_type_boolean) goto switchD_00384567_caseD_30;
      uVar10 = (undefined1)(this->_data).variable[1]._type;
      goto switchD_00384567_caseD_2f;
    }
switchD_00384536_caseD_9:
    cVar1 = this->_rettype;
    if (cVar1 == '\x01') {
      pxVar19 = stack->result;
      pxVar25 = pxVar19->_root;
      sVar18 = pxVar19->_root_size;
      eval_node_set((xpath_node_set_raw *)&local_a0,this,c,stack,nodeset_eval_any);
      uVar10 = local_98 != local_90;
      pxVar5 = pxVar19->_root;
      while (pxVar5 != pxVar25) {
        pxVar5 = pxVar5->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
    }
    else {
      if (cVar1 != '\x03') {
        if (cVar1 != '\x02') {
          __assert_fail("false && \"Wrong expression for return type boolean\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x298b,
                        "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                       );
        }
        dVar27 = eval_number(this,c,stack);
        if ((dVar27 != 0.0) || (NAN(dVar27))) {
          uVar10 = xpath_type_node_set;
          goto switchD_00384567_caseD_2f;
        }
        goto switchD_00384567_caseD_30;
      }
      pxVar19 = stack->result;
      pxVar25 = pxVar19->_root;
      sVar18 = pxVar19->_root_size;
      eval_string((xpath_string *)&local_a0,this,c,stack);
      uVar10 = (char)local_a0->header != '\0';
      pxVar5 = pxVar19->_root;
      while (pxVar5 != pxVar25) {
        pxVar5 = pxVar5->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
    }
    pxVar19->_root = pxVar25;
    pxVar19->_root_size = sVar18;
    goto switchD_00384567_caseD_2f;
  default:
    switch(cVar1) {
    case '\"':
      pxVar19 = stack->result;
      pxVar25 = pxVar19->_root;
      sVar18 = pxVar19->_root_size;
      eval_string((xpath_string *)&local_a0,this->_left,c,stack);
      eval_string((xpath_string *)&local_80,this->_right,c,stack);
      cVar1 = (char)local_80->header;
      uVar10 = cVar1 == '\0';
      if ((bool)uVar10) goto LAB_0038486b;
      if ((char)local_a0->header != cVar1) goto LAB_00384869;
      lVar16 = 1;
      goto LAB_00384850;
    case '#':
      pxVar19 = stack->result;
      pxVar25 = pxVar19->_root;
      sVar18 = pxVar19->_root_size;
      eval_string((xpath_string *)&local_a0,this->_left,c,stack);
      eval_string((xpath_string *)&local_80,this->_right,c,stack);
      pcVar15 = strstr((char *)local_a0,(char *)local_80);
      uVar10 = pcVar15 != (char *)0x0;
      pxVar5 = pxVar19->_root;
      while (pxVar5 != pxVar25) {
        pxVar5 = pxVar5->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
      pxVar19->_root = pxVar25;
      pxVar19->_root_size = sVar18;
      goto switchD_00384567_caseD_2f;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      goto switchD_00384536_caseD_9;
    case '-':
      goto switchD_00384567_caseD_2d;
    case '.':
      bVar9 = eval_boolean(this->_left,c,stack);
      goto LAB_00384b90;
    case '/':
      goto switchD_00384567_caseD_2f;
    case '0':
      break;
    case '1':
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        pxVar19 = stack->result;
        pxVar25 = pxVar19->_root;
        sVar18 = pxVar19->_root_size;
        eval_string((xpath_string *)&local_a0,this->_left,c,stack);
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          local_80 = (c->n)._node._root;
        }
        else {
          xml_node::xml_node((xml_node *)&local_80);
        }
        if (local_80 == (xml_node_struct *)0x0) goto LAB_00384d58;
        pxVar17 = pxVar19;
        goto LAB_00384c5d;
      }
      break;
    default:
      if (cVar1 != ';') goto switchD_00384536_caseD_9;
      dst = (int *)(this->_right->_data).string;
      if (this->_right->_type != '\x12') {
        if (*dst == 3) {
          piVar12 = *(int **)(dst + 4);
        }
        else {
          piVar12 = (int *)0x0;
        }
        dst = (int *)0x41f4cd;
        if (piVar12 != (int *)0x0) {
          dst = piVar12;
        }
      }
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        local_a0 = (c->n)._node._root;
      }
      else {
        xml_node::xml_node((xml_node *)&local_a0);
      }
      xVar13 = xml_node::attribute((xml_node *)&local_a0,(this->_left->_data).string);
      if (xVar13._attr != (xml_attribute_struct *)0x0) {
        src = (xVar13._attr)->value;
        if (src == (char_t *)0x0) {
          src = "";
        }
        bVar9 = strequal(src,(char_t *)dst);
        if (bVar9) {
          pcVar15 = "";
          if ((xVar13._attr)->name != (char_t *)0x0) {
            pcVar15 = (xVar13._attr)->name;
          }
          uVar10 = is_xpath_attribute(pcVar15);
          goto switchD_00384567_caseD_2f;
        }
      }
      uVar10 = xpath_type_none;
      goto switchD_00384567_caseD_2f;
    }
switchD_00384567_caseD_30:
    uVar10 = xpath_type_none;
    goto switchD_00384567_caseD_2f;
  }
  this = this->_right;
  goto LAB_0038451f;
  while (xml_node::xml_node((xml_node *)&local_80,pxVar8->parent),
        local_80 != (xml_node_struct *)0x0) {
LAB_00384c5d:
    pxVar8 = local_80;
    local_60._buffer = (char_t *)local_80;
    xVar13 = xml_node::attribute((xml_node *)&local_60,"xml:lang");
    if (xVar13._attr != (xml_attribute_struct *)0x0) {
      pbVar14 = (byte *)(xVar13._attr)->value;
      if (pbVar14 == (byte *)0x0) {
        pbVar14 = (byte *)0x41f4cd;
      }
      bVar3 = (byte)local_a0->header;
      bVar9 = bVar3 == 0;
      if (!bVar9) {
        bVar23 = bVar3 | 0x20;
        if (0x19 < (int)(char)bVar3 - 0x41U) {
          bVar23 = bVar3;
        }
        bVar3 = *pbVar14;
        bVar24 = bVar3 | 0x20;
        if (0x19 < (int)(char)bVar3 - 0x41U) {
          bVar24 = bVar3;
        }
        pxVar7 = local_a0;
        if (bVar23 == bVar24) {
          do {
            pbVar14 = pbVar14 + 1;
            pxVar7 = (xml_node_struct *)((long)&pxVar7->header + 1);
            bVar3 = *(byte *)pxVar7;
            bVar9 = bVar3 == 0;
            if (bVar9) goto LAB_00384d21;
            bVar23 = bVar3 | 0x20;
            if (0x19 < (int)(char)bVar3 - 0x41U) {
              bVar23 = bVar3;
            }
            bVar3 = *pbVar14;
            bVar24 = bVar3 | 0x20;
            if (0x19 < (int)(char)bVar3 - 0x41U) {
              bVar24 = bVar3;
            }
          } while (bVar23 == bVar24);
        }
        pxVar17 = (xpath_allocator *)0x0;
      }
LAB_00384d21:
      if (bVar9) {
        pxVar17 = (xpath_allocator *)(ulong)(*pbVar14 == 0x2d || *pbVar14 == 0);
      }
    }
    uVar10 = SUB81(pxVar17,0);
    if (xVar13._attr != (xml_attribute_struct *)0x0) goto LAB_00384d5a;
  }
LAB_00384d58:
  uVar10 = xpath_type_none;
  local_60._buffer = (char_t *)local_80;
LAB_00384d5a:
  pxVar5 = pxVar19->_root;
  while (pxVar5 != pxVar25) {
    pxVar5 = pxVar5->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  pxVar19->_root = pxVar25;
  pxVar19->_root_size = sVar18;
  goto switchD_00384567_caseD_2f;
switchD_00384567_caseD_2d:
  this = this->_left;
  goto LAB_0038451f;
  while (pcVar15 = (char *)((long)&local_a0->header + lVar16), lVar16 = lVar16 + 1,
        *pcVar15 == cVar1) {
LAB_00384850:
    cVar1 = *(char *)((long)&local_80->header + lVar16);
    uVar10 = cVar1 == '\0';
    if ((bool)uVar10) goto LAB_0038486b;
  }
LAB_00384869:
  uVar10 = false;
LAB_0038486b:
  pxVar5 = pxVar19->_root;
  while (pxVar5 != pxVar25) {
    pxVar5 = pxVar5->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  pxVar19->_root = pxVar25;
  pxVar19->_root_size = sVar18;
  goto switchD_00384567_caseD_2f;
LAB_00385409:
  uVar10 = !bVar9;
  if (bVar9) goto LAB_0038547b;
  pxVar17 = stack->result;
  pxVar5 = pxVar17->_root;
  sVar18 = pxVar17->_root_size;
  string_value((xpath_string *)&local_80,pxVar20,pxVar17);
  dVar28 = convert_string_to_number((char_t *)local_80);
  pxVar6 = pxVar17->_root;
  while (pxVar6 != pxVar5) {
    pxVar6 = pxVar6->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  pxVar17->_root = pxVar5;
  pxVar17->_root_size = sVar18;
  if ((dVar27 != dVar28) || (NAN(dVar27) || NAN(dVar28))) goto LAB_0038547b;
  pxVar20 = pxVar20 + 1;
  bVar9 = pxVar20 == local_90;
  goto LAB_00385409;
LAB_0038547b:
  pxVar5 = pxVar19->_root;
  while (pxVar5 != pxVar25) {
    pxVar5 = pxVar5->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  goto LAB_00385006;
LAB_00385311:
  uVar10 = !bVar9;
  if (bVar9) goto LAB_00385383;
  pxVar17 = stack->result;
  pxVar5 = pxVar17->_root;
  sVar18 = pxVar17->_root_size;
  string_value(&local_60,pxVar20,pxVar17);
  bVar9 = strequal((char_t *)local_80,local_60._buffer);
  pxVar6 = pxVar17->_root;
  while (pxVar6 != pxVar5) {
    pxVar6 = pxVar6->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  pxVar17->_root = pxVar5;
  pxVar17->_root_size = sVar18;
  if (!bVar9) goto LAB_00385383;
  pxVar20 = pxVar20 + 1;
  bVar9 = pxVar20 == local_90;
  goto LAB_00385311;
LAB_00385383:
  pxVar5 = pxVar19->_root;
  while (pxVar5 != pxVar25) {
    pxVar5 = pxVar5->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
LAB_00384f08:
  pxVar19->_root = pxVar25;
  local_a8 = local_b8;
  goto LAB_0038500e;
switchD_00384536_caseD_3:
  pxVar21 = this->_left;
  pxVar22 = this->_right;
  cVar1 = pxVar21->_rettype;
  cVar2 = pxVar22->_rettype;
  if (cVar2 == '\x01' || cVar1 == '\x01') {
    if (cVar2 == '\x01' && cVar1 == '\x01') {
      pxVar19 = stack->result;
      pxVar25 = pxVar19->_root;
      local_a8 = pxVar19->_root_size;
      eval_node_set((xpath_node_set_raw *)&local_a0,pxVar21,c,stack,nodeset_eval_all);
      eval_node_set((xpath_node_set_raw *)&local_80,pxVar22,c,stack,nodeset_eval_all);
      local_c0 = local_98;
      uVar10 = local_98 != local_90;
      if ((bool)uVar10) {
        uVar10 = true;
        pxVar20 = local_78;
        do {
          for (; pxVar20 != local_70; pxVar20 = pxVar20 + 1) {
            pxVar17 = stack->result;
            pxVar5 = pxVar17->_root;
            sVar18 = pxVar17->_root_size;
            string_value(&local_60,local_c0,pxVar17);
            string_value(&local_48,pxVar20,stack->result);
            bVar9 = strequal(local_60._buffer,local_48._buffer);
            pxVar6 = pxVar17->_root;
            while (pxVar6 != pxVar5) {
              pxVar6 = pxVar6->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            pxVar17->_root = pxVar5;
            pxVar17->_root_size = sVar18;
            if (bVar9) goto LAB_00384a74;
          }
          local_c0 = local_c0 + 1;
          uVar10 = local_c0 != local_90;
          pxVar20 = local_78;
        } while ((bool)uVar10);
      }
LAB_00384a74:
      pxVar5 = pxVar19->_root;
      while (pxVar5 != pxVar25) {
        pxVar5 = pxVar5->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
    }
    else {
      this_00 = pxVar21;
      if (cVar1 == '\x01') {
        this_00 = pxVar22;
        cVar1 = cVar2;
        pxVar22 = pxVar21;
      }
      if (cVar1 != '\x02') {
        if (cVar1 == '\x03') {
          pxVar19 = stack->result;
          pxVar25 = pxVar19->_root;
          local_b8 = pxVar19->_root_size;
          eval_string((xpath_string *)&local_80,this_00,c,stack);
          eval_node_set((xpath_node_set_raw *)&local_a0,pxVar22,c,stack,nodeset_eval_all);
          uVar10 = local_98 != local_90;
          pxVar20 = local_98;
          if ((bool)uVar10) {
            do {
              pxVar17 = stack->result;
              pxVar5 = pxVar17->_root;
              sVar18 = pxVar17->_root_size;
              string_value(&local_60,pxVar20,pxVar17);
              bVar9 = strequal((char_t *)local_80,local_60._buffer);
              pxVar6 = pxVar17->_root;
              while (pxVar6 != pxVar5) {
                pxVar6 = pxVar6->next;
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          deallocate)();
              }
              pxVar17->_root = pxVar5;
              pxVar17->_root_size = sVar18;
              if (bVar9) break;
              pxVar20 = pxVar20 + 1;
              uVar10 = pxVar20 != local_90;
            } while ((bool)uVar10);
          }
          pxVar5 = pxVar19->_root;
          while (pxVar5 != pxVar25) {
            pxVar5 = pxVar5->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
          goto LAB_00384f08;
        }
        if (cVar1 != '\x04') goto LAB_003854e5;
        bVar11 = eval_boolean(this_00,c,stack);
        goto LAB_00384b86;
      }
      pxVar19 = stack->result;
      pxVar25 = pxVar19->_root;
      local_a8 = pxVar19->_root_size;
      dVar27 = eval_number(this_00,c,stack);
      eval_node_set((xpath_node_set_raw *)&local_a0,pxVar22,c,stack,nodeset_eval_all);
      uVar10 = local_98 != local_90;
      pxVar20 = local_98;
      if ((bool)uVar10) {
        do {
          pxVar17 = stack->result;
          pxVar5 = pxVar17->_root;
          sVar18 = pxVar17->_root_size;
          string_value((xpath_string *)&local_80,pxVar20,pxVar17);
          dVar28 = convert_string_to_number((char_t *)local_80);
          pxVar6 = pxVar17->_root;
          while (pxVar6 != pxVar5) {
            pxVar6 = pxVar6->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
          pxVar17->_root = pxVar5;
          pxVar17->_root_size = sVar18;
          if ((dVar27 == dVar28) && (!NAN(dVar27) && !NAN(dVar28))) break;
          pxVar20 = pxVar20 + 1;
          uVar10 = pxVar20 != local_90;
        } while ((bool)uVar10);
      }
      pxVar5 = pxVar19->_root;
      while (pxVar5 != pxVar25) {
        pxVar5 = pxVar5->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
    }
    goto LAB_00385006;
  }
  if (cVar2 == '\x04' || cVar1 == '\x04') {
    bVar11 = eval_boolean(pxVar21,c,stack);
LAB_00384b86:
    bVar9 = eval_boolean(pxVar22,c,stack);
    bVar9 = (bool)(bVar9 ^ bVar11);
LAB_00384b90:
    uVar10 = bVar9 ^ uVar26 ^ xpath_type_node_set;
    goto LAB_0038501a;
  }
  if (cVar1 == '\x02' || cVar2 == '\x02') {
    dVar27 = eval_number(pxVar21,c,stack);
    dVar28 = eval_number(pxVar22,c,stack);
    uVar10 = dVar28 == dVar27;
  }
  else {
    if (cVar1 != '\x03' && cVar2 != '\x03') {
LAB_003854e5:
      pcVar15 = 
      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::equal_to]"
      ;
LAB_003854fa:
      __assert_fail("false && \"Wrong types\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x265a,pcVar15);
    }
    pxVar19 = stack->result;
    pxVar25 = pxVar19->_root;
    local_c8 = pxVar19->_root_size;
    eval_string((xpath_string *)&local_a0,pxVar21,c,stack);
    eval_string((xpath_string *)&local_80,pxVar22,c,stack);
    uVar10 = strequal((char_t *)local_a0,(char_t *)local_80);
    pxVar5 = pxVar19->_root;
    while (pxVar5 != pxVar25) {
      pxVar5 = pxVar5->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    pxVar19->_root = pxVar25;
LAB_00384e0d:
    pxVar19->_root_size = local_c8;
  }
  goto switchD_00384567_caseD_2f;
  while( true ) {
    local_c0 = local_c0 + 1;
    uVar10 = local_c0 != local_90;
    pxVar20 = local_78;
    if (!(bool)uVar10) break;
LAB_003850b1:
    if (pxVar20 != local_70) {
      pxVar17 = stack->result;
      pxVar5 = pxVar17->_root;
      sVar18 = pxVar17->_root_size;
      string_value(&local_60,local_c0,pxVar17);
      string_value(&local_48,pxVar20,stack->result);
      bVar9 = strequal(local_60._buffer,local_48._buffer);
      pxVar6 = pxVar17->_root;
      while (pxVar6 != pxVar5) {
        pxVar6 = pxVar6->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
      pxVar17->_root = pxVar5;
      pxVar17->_root_size = sVar18;
      if (!bVar9) break;
      pxVar20 = pxVar20 + 1;
      goto LAB_003850b1;
    }
  }
LAB_0038515e:
  pxVar5 = pxVar19->_root;
  while (pxVar5 != pxVar25) {
    pxVar5 = pxVar5->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
LAB_00385006:
  pxVar19->_root = pxVar25;
LAB_0038500e:
  pxVar19->_root_size = local_a8;
switchD_00384567_caseD_2f:
  uVar10 = uVar10 ^ uVar26;
LAB_0038501a:
  return (bool)(uVar10 & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != 0;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_number:
				return convert_number_to_boolean(eval_number(c, stack));

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_string(c, stack).empty();
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_node_set(c, stack, nodeset_eval_any).empty();
			}

			default:
				assert(false && "Wrong expression for return type boolean"); // unreachable
				return false;
			}
		}